

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O3

_Bool do_vfp_2op_dp(DisasContext_conflict1 *s,VFPGen2OpDPFn_conflict *fn,int vd,int vm)

{
  TCGContext_conflict1 *s_00;
  _Bool _Var1;
  uint uVar2;
  TCGTemp *a1;
  TCGTemp *a1_00;
  uint uVar3;
  TCGArg a3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar3 = s->isar->mvfr0;
  if ((uVar3 & 0xf00) != 0) {
    s_00 = s->uc->tcg_ctx;
    iVar5 = s->vec_len;
    if (((uVar3 & 0xe) != 0) || (((vm | vd) & 0x10U) == 0)) {
      if ((uVar3 & 0xf000000) == 0) {
        if (iVar5 != 0) {
          return false;
        }
        if (s->vec_stride != 0) {
          return false;
        }
        _Var1 = full_vfp_access_check(s,false);
        uVar3 = 0;
        iVar5 = 0;
        uVar2 = 0;
        if (!_Var1) {
          return true;
        }
      }
      else {
        _Var1 = full_vfp_access_check(s,false);
        if (!_Var1) {
          return true;
        }
        if (iVar5 < 1) {
          uVar3 = 0;
          uVar2 = 0;
        }
        else if ((vd & 0xcU) == 0) {
          uVar3 = 0;
          iVar5 = 0;
          uVar2 = 0;
        }
        else {
          uVar3 = (s->vec_stride >> 1) + 1;
          uVar2 = vm & 0xcU;
          if ((vm & 0xcU) != 0) {
            uVar2 = uVar3;
          }
        }
      }
      a1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      a1_00 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      a3 = (ulong)((uint)vm >> 1) * 0x100 + (ulong)(vm & 1) * 8 + 0xc10;
      tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i64,(TCGArg)a1,(TCGArg)(s_00->cpu_env + (long)s_00),a3);
      uVar6 = (ulong)(uint)vd;
      iVar4 = iVar5;
      while( true ) {
        (*fn)(s_00,(TCGv_i64)((long)a1_00 - (long)s_00),(TCGv_i64)((long)a1 - (long)s_00));
        tcg_gen_op3_aarch64(s_00,INDEX_op_st_i64,(TCGArg)a1_00,(TCGArg)(s_00->cpu_env + (long)s_00),
                            (uVar6 >> 1) * 0x100 + (ulong)((uint)uVar6 & 1) * 8 + 0xc10);
        bVar7 = iVar4 == 0;
        iVar4 = iVar4 + -1;
        if (bVar7) break;
        if (uVar2 == 0) goto LAB_006626bc;
        tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i64,(TCGArg)a1,(TCGArg)(s_00->cpu_env + (long)s_00),a3)
        ;
        uVar6 = (ulong)(vm & 0xfffffffcU | uVar2 + vm & 3);
      }
      goto LAB_00662702;
    }
  }
  return false;
LAB_006626bc:
  do {
    uVar2 = uVar3 + vd;
    vd = vd & 0xfffffffcU | uVar2 & 3;
    tcg_gen_op3_aarch64(s_00,INDEX_op_st_i64,(TCGArg)a1_00,(TCGArg)(s_00->cpu_env + (long)s_00),
                        (ulong)((uint)vd >> 1) * 0x100 + (ulong)(uVar2 & 1) * 8 + 0xc10);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
LAB_00662702:
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)((TCGv_i64)((long)a1 - (long)s_00) + (long)s_00));
  tcg_temp_free_internal_aarch64
            (s_00,(TCGTemp *)((TCGv_i64)((long)a1_00 - (long)s_00) + (long)s_00));
  return true;
}

Assistant:

static bool do_vfp_2op_dp(DisasContext *s, VFPGen2OpDPFn *fn, int vd, int vm)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t delta_m = 0;
    uint32_t delta_d = 0;
    int veclen = s->vec_len;
    TCGv_i64 f0, fd;

    if (!dc_isar_feature(aa32_fpdp_v2, s)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist */
    if (!dc_isar_feature(aa32_simd_r32, s) && ((vd | vm) & 0x10)) {
        return false;
    }

    if (!dc_isar_feature(aa32_fpshvec, s) &&
        (veclen != 0 || s->vec_stride != 0)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    if (veclen > 0) {
        /* Figure out what type of vector operation this is.  */
        if (vfp_dreg_is_scalar(vd)) {
            /* scalar */
            veclen = 0;
        } else {
            delta_d = (s->vec_stride >> 1) + 1;

            if (vfp_dreg_is_scalar(vm)) {
                /* mixed scalar/vector */
                delta_m = 0;
            } else {
                /* vector */
                delta_m = delta_d;
            }
        }
    }

    f0 = tcg_temp_new_i64(tcg_ctx);
    fd = tcg_temp_new_i64(tcg_ctx);

    neon_load_reg64(tcg_ctx, f0, vm);

    for (;;) {
        fn(tcg_ctx, fd, f0);
        neon_store_reg64(tcg_ctx, fd, vd);

        if (veclen == 0) {
            break;
        }

        if (delta_m == 0) {
            /* single source one-many */
            while (veclen--) {
                vd = vfp_advance_dreg(vd, delta_d);
                neon_store_reg64(tcg_ctx, fd, vd);
            }
            break;
        }

        /* Set up the operands for the next iteration */
        veclen--;
        vd = vfp_advance_dreg(vd, delta_d);
        vd = vfp_advance_dreg(vm, delta_m);
        neon_load_reg64(tcg_ctx, f0, vm);
    }

    tcg_temp_free_i64(tcg_ctx, f0);
    tcg_temp_free_i64(tcg_ctx, fd);

    return true;
}